

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bipartition.cpp
# Opt level: O1

bool __thiscall Bipartition::isEmpty(Bipartition *this)

{
  pointer puVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  puVar1 = (this->partition).m_bits.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = (long)(this->partition).m_bits.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  bVar7 = lVar2 != 0;
  if (bVar7) {
    uVar3 = lVar2 >> 3;
    uVar4 = uVar3 + (uVar3 == 0);
    if (*puVar1 != 0) goto LAB_0013fddd;
    uVar5 = 0;
    do {
      uVar6 = uVar4;
      if (uVar4 - 1 == uVar5) break;
      uVar6 = uVar5 + 1;
      lVar2 = uVar5 + 1;
      uVar5 = uVar6;
    } while (puVar1[lVar2] == 0);
    bVar7 = uVar6 < uVar3;
  }
  if (!bVar7) {
    return true;
  }
LAB_0013fddd:
  bVar7 = boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::all
                    (&this->partition);
  return bVar7;
}

Assistant:

bool Bipartition::isEmpty() {
    return partition.none() || partition.all();
}